

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmpm<(moira::Instr)40,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  u32 local_20;
  u32 local_1c;
  u32 local_18;
  u32 local_14;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,64ul>(this,opcode & 7,&local_14,&local_1c);
  if (bVar1) {
    bVar1 = readOp<(moira::Mode)3,(moira::Size)4,64ul>(this,opcode >> 9 & 7,&local_18,&local_20);
    if (bVar1) {
      cmp<(moira::Size)4>(this,local_1c,local_20);
      prefetch<4ul>(this);
    }
  }
  return;
}

Assistant:

void
Moira::execCmpm(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;

    if (!readOp<M,S, AE_INC_PC>(src, ea1, data1)) return;
    if (!readOp<M,S, AE_INC_PC>(dst, ea2, data2)) return;

    cmp<S>(data1, data2);
    prefetch<POLLIPL>();
}